

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_bitstream.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long in_RAX;
  long local_38;
  
  local_38 = in_RAX;
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_bitstream_r_1");
  buffer[0] = 0xf0;
  buffer[1] = '\x11';
  buffer[2] = '\"';
  bitstream_r_init(&_stream_r,buffer,3);
  iVar1 = bitstream_r_read(&_stream_r,&local_38,3);
  cunit_named_check(iVar1 == 0,"test_bitstream_r_1",0x4d,"failed to read 3 bits");
  cunit_named_check(local_38 == 7,"test_bitstream_r_1",0x4e,"bits are not 0x07 but 0x%lx");
  iVar1 = bitstream_r_read(&_stream_r,&local_38,2);
  cunit_named_check(iVar1 == 0,"test_bitstream_r_1",0x51,"failed to read 2 bits");
  cunit_named_check(local_38 == 2,"test_bitstream_r_1",0x52,"bits are not 0x02 but 0x%lx");
  iVar1 = bitstream_r_read(&_stream_r,&local_38,8);
  cunit_named_check(iVar1 == 0,"test_bitstream_r_1",0x55,"failed to read 8 bits");
  cunit_named_check(local_38 == 2,"test_bitstream_r_1",0x56,"bits are not 0x02 but 0x%lx");
  bitstream_r_pad(&_stream_r);
  cunit_named_check(_stream_r.bit_offset == 0x10,"test_bitstream_r_1",0x5c,
                    "bit offset is not 16 but %zu");
  iVar1 = bitstream_r_read(&_stream_r,&local_38,4);
  cunit_named_check(iVar1 == 0,"test_bitstream_r_1",0x5f,"failed to read 4 bits");
  cunit_named_check(local_38 == 2,"test_bitstream_r_1",0x60,"bits are not 0x02 but 0x%lx");
  cunit_end_test("test_bitstream_r_1");
  cunit_start_test("test_bitstream_r_2");
  bitstream_r_init(&_stream_r,buffer,0x20);
  iVar1 = bitstream_r_read(&_stream_r,&local_38,0x39);
  cunit_named_check(iVar1 != 0,"test_bitstream_r_2",0x6e,"should fail reading 57 bits");
  cunit_end_test("test_bitstream_r_2");
  cunit_start_test("test_bitstream_r_3");
  bitstream_r_init(&_stream_r,buffer,3);
  iVar1 = bitstream_r_read(&_stream_r,&local_38,0x19);
  cunit_named_check(iVar1 != 0,"test_bitstream_r_3",0x7c,"should fail reading 57 bits");
  cunit_end_test("test_bitstream_r_3");
  cunit_start_test("test_bitstream_r_4");
  bitstream_r_init(&_stream_r,buffer,3);
  iVar1 = bitstream_r_read(&_stream_r,&local_38,0xc);
  cunit_named_check(iVar1 == 0,"test_bitstream_r_4",0x8a,"failed to read 12 bits");
  iVar1 = bitstream_r_read(&_stream_r,&local_38,0xd);
  cunit_named_check(iVar1 != 0,"test_bitstream_r_4",0x8d,"should fail reading 13 more bits");
  cunit_end_test("test_bitstream_r_4");
  cunit_start_test("test_bitstream_w_1");
  bitstream_w_init(&_stream_w,buffer,3);
  iVar1 = bitstream_w_write(&_stream_w,7,3);
  cunit_named_check(iVar1 == 0,"test_bitstream_w_1",0x99,"failed writing 111");
  cunit_named_check(buffer[0] == 0xe0,"test_bitstream_w_1",0x9a,"First byte is not 0xe0 but 0x%02x")
  ;
  iVar1 = bitstream_w_write(&_stream_w,2,2);
  cunit_named_check(iVar1 == 0,"test_bitstream_w_1",0x9d,"failed writing 10");
  cunit_named_check(buffer[0] == 0xf0,"test_bitstream_w_1",0x9e,"First byte is not 0xf0 but 0x%02x")
  ;
  iVar1 = bitstream_w_write(&_stream_w,2,8);
  cunit_named_check(iVar1 == 0,"test_bitstream_w_1",0xa1,"failed writing 00000010");
  cunit_named_check(buffer[0] == 0xf0,"test_bitstream_w_1",0xa2,"First byte is not 0xf0 but 0x%02x")
  ;
  cunit_named_check(buffer[1] == '\x10',"test_bitstream_w_1",0xa3,
                    "Second byte is not 0x10 but 0x%02x");
  bitstream_w_pad(&_stream_w);
  iVar1 = bitstream_w_write(&_stream_w,2,4);
  cunit_named_check(iVar1 == 0,"test_bitstream_w_1",0xa9,"failed writing 0010");
  cunit_named_check(buffer[0] == 0xf0,"test_bitstream_w_1",0xaa,"First byte is not 0xf0 but 0x%02x")
  ;
  cunit_named_check(buffer[1] == '\x10',"test_bitstream_w_1",0xab,
                    "Second byte is not 0x10 but 0x%02x");
  cunit_named_check(buffer[2] == ' ',"test_bitstream_w_1",0xac,"Second byte is not 0x20 but 0x%02x")
  ;
  cunit_named_check(_stream_w.bit_offset + 7 >> 3 == 3,"test_bitstream_w_1",0xb1,
                    "stream was not 3 but %zu bytes long");
  cunit_end_test("test_bitstream_w_1");
  cunit_start_test("test_bitstream_w_2");
  bitstream_w_init(&_stream_w,buffer,0x20);
  iVar1 = bitstream_w_write(&_stream_w,0,0x39);
  cunit_named_check(iVar1 != 0,"test_bitstream_w_2",0xbd,"should fail writing 57 bits");
  cunit_named_check(_stream_w.bit_offset + 7 < 8,"test_bitstream_w_2",0xc2,
                    "stream was not 0 but %zu bytes long",_stream_w.bit_offset + 7 >> 3);
  cunit_end_test("test_bitstream_w_2");
  cunit_start_test("test_bitstream_w_3");
  bitstream_w_init(&_stream_w,buffer,3);
  iVar1 = bitstream_w_write(&_stream_w,0,0x19);
  cunit_named_check(iVar1 != 0,"test_bitstream_w_3",0xce,"should fail writing 25 bits");
  cunit_named_check(_stream_w.bit_offset + 7 < 8,"test_bitstream_w_3",0xd3,
                    "stream was not 0 but %zu bytes long",_stream_w.bit_offset + 7 >> 3);
  cunit_end_test("test_bitstream_w_3");
  cunit_start_test("test_bitstream_w_4");
  bitstream_w_init(&_stream_w,buffer,3);
  iVar1 = bitstream_w_write(&_stream_w,0,0x18);
  cunit_named_check(iVar1 == 0,"test_bitstream_w_4",0xdf,"failed writing 24 bits");
  cunit_named_check(_stream_w.bit_offset + 7 >> 3 == 3,"test_bitstream_w_4",0xe4,
                    "stream was not 3 but %zu bytes long");
  cunit_end_test("test_bitstream_w_4");
  cunit_start_test("test_bitstream_w_5");
  bitstream_w_init(&_stream_w,buffer,3);
  iVar1 = bitstream_w_write(&_stream_w,0,0xc);
  cunit_named_check(iVar1 == 0,"test_bitstream_w_5",0xf0,"failed to write 12 bits");
  iVar1 = bitstream_w_write(&_stream_w,0,0xd);
  cunit_named_check(iVar1 != 0,"test_bitstream_w_5",0xf3,"should fail writing 13 more bits");
  cunit_named_check(_stream_w.bit_offset + 7 >> 3 == 2,"test_bitstream_w_5",0xf8,
                    "stream was not 2 but %zu bytes long");
  cunit_end_test("test_bitstream_w_5");
  cunit_start_test("test_bitstream_w_6");
  bitstream_w_init(&_stream_w,buffer,3);
  iVar1 = bitstream_w_write(&_stream_w,0xeeeeff,7);
  cunit_named_check(iVar1 == 0,"test_bitstream_w_6",0x104,"failed to write 7 bits");
  cunit_named_check(buffer[0] == 0xfe,"test_bitstream_w_6",0x105,"First byte is not 0xfe but 0x%02x"
                   );
  cunit_named_check(buffer[1] == '\0',"test_bitstream_w_6",0x106,
                    "Second byte is not 0x00 but 0x%02x");
  cunit_named_check(buffer[2] == '\0',"test_bitstream_w_6",0x107,
                    "Second byte is not 0x00 but 0x%02x");
  cunit_named_check(_stream_w.bit_offset + 7 >> 3 == 1,"test_bitstream_w_6",0x10c,
                    "stream was not 1 but %zu bytes long");
  cunit_end_test("test_bitstream_w_6");
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int
main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(clear_elements);

  test_bitstream_r_1();
  test_bitstream_r_2();
  test_bitstream_r_3();
  test_bitstream_r_4();

  test_bitstream_w_1();
  test_bitstream_w_2();
  test_bitstream_w_3();
  test_bitstream_w_4();
  test_bitstream_w_5();
  test_bitstream_w_6();

  return FINISH_TESTING();
}